

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void * probe_access_mips(CPUArchState_conflict5 *env,target_ulong_conflict addr,int size,
                        MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  _Bool _Var1;
  CPUState *pCVar2;
  CPUTLB_conflict3 *pCVar3;
  CPUIOTLBEntry *iotlbentry_00;
  CPUIOTLBEntry *iotlbentry;
  size_t sStack_50;
  int wp_access;
  size_t elt_ofs;
  CPUTLBEntry *pCStack_40;
  target_ulong_conflict tlb_addr;
  CPUTLBEntry *entry;
  uintptr_t index;
  uintptr_t retaddr_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  target_ulong_conflict addr_local;
  CPUArchState_conflict5 *env_local;
  
  entry = (CPUTLBEntry *)tlb_index(env,(long)mmu_idx,addr);
  pCStack_40 = tlb_entry(env,(long)mmu_idx,addr);
  if (-(addr | 0xfffff000) < (uint)size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4ab,"-(addr | TARGET_PAGE_MASK) >= size");
  }
  if (access_type == MMU_DATA_LOAD) {
    sStack_50 = 0;
    iotlbentry._4_4_ = 1;
  }
  else if (access_type == MMU_DATA_STORE) {
    sStack_50 = 4;
    iotlbentry._4_4_ = 2;
  }
  else {
    if (access_type != MMU_INST_FETCH) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                 ,0x4bc,(char *)0x0);
    }
    sStack_50 = 8;
    iotlbentry._4_4_ = 1;
  }
  elt_ofs._4_4_ = tlb_read_ofs(pCStack_40,sStack_50);
  _Var1 = tlb_hit(env->uc,elt_ofs._4_4_,addr);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    _Var1 = victim_tlb_hit(env,(long)mmu_idx,(size_t)entry,sStack_50,addr & 0xfffff000);
    if (!_Var1) {
      pCVar2 = env_cpu(env);
      tlb_fill(pCVar2,addr,size,access_type,mmu_idx,retaddr);
      entry = (CPUTLBEntry *)tlb_index(env,(long)mmu_idx,addr);
      pCStack_40 = tlb_entry(env,(long)mmu_idx,addr);
    }
    elt_ofs._4_4_ = tlb_read_ofs(pCStack_40,sStack_50);
  }
  if (size == 0) {
    env_local = (CPUArchState_conflict5 *)0x0;
  }
  else {
    if ((elt_ofs._4_4_ & 0xfc0) != 0) {
      pCVar3 = env_tlb(env);
      iotlbentry_00 = pCVar3->d[mmu_idx].iotlb + (long)entry;
      if ((elt_ofs._4_4_ & 0x2c0) != 0) {
        return (void *)0x0;
      }
      if ((elt_ofs._4_4_ & 0x100) != 0) {
        pCVar2 = env_cpu(env);
        cpu_check_watchpoint_mips
                  (pCVar2,(ulong)addr,(long)size,iotlbentry_00->attrs,iotlbentry._4_4_,retaddr);
      }
      if ((elt_ofs._4_4_ & 0x400) != 0) {
        pCVar2 = env_cpu(env);
        notdirty_write(pCVar2,(ulong)addr,size,iotlbentry_00,retaddr);
      }
    }
    env_local = (CPUArchState_conflict5 *)
                ((ulong)addr + *(long *)((long)&pCStack_40->field_0 + 0x10));
  }
  return env_local;
}

Assistant:

void *probe_access(CPUArchState *env, target_ulong addr, int size,
                   MMUAccessType access_type, int mmu_idx, uintptr_t retaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = env->uc;
#endif
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr;
    size_t elt_ofs = 0;
    int wp_access = 0;

#ifdef _MSC_VER
    g_assert(((target_ulong)0 - (addr | TARGET_PAGE_MASK)) >= size);
#else
    g_assert(-(addr | TARGET_PAGE_MASK) >= size);
#endif

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        wp_access = BP_MEM_READ;
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        wp_access = BP_MEM_WRITE;
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        wp_access = BP_MEM_READ;
        break;
    default:
        g_assert_not_reached();
    }
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (unlikely(!tlb_hit(env->uc, tlb_addr, addr))) {
        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs,
                            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size, access_type, mmu_idx, retaddr);
            /* TLB resize via tlb_fill may have moved the entry. */
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (!size) {
        return NULL;
    }

    if (unlikely(tlb_addr & TLB_FLAGS_MASK)) {
        CPUIOTLBEntry *iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Reject I/O access, or other required slow-path.  */
        if (tlb_addr & (TLB_MMIO | TLB_BSWAP | TLB_DISCARD_WRITE)) {
            return NULL;
        }

        /* Handle watchpoints.  */
        if (tlb_addr & TLB_WATCHPOINT) {
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, wp_access, retaddr);
        }

        /* Handle clean RAM pages.  */
        if (tlb_addr & TLB_NOTDIRTY) {
            notdirty_write(env_cpu(env), addr, size, iotlbentry, retaddr);
        }
    }

    return (void *)((uintptr_t)addr + entry->addend);
}